

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.h
# Opt level: O0

void __thiscall spvtools::opt::VectorDCE::VectorDCE(VectorDCE *this)

{
  uint local_14;
  uint32_t i;
  VectorDCE *this_local;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__VectorDCE_010eb588;
  utils::BitVector::BitVector(&this->all_components_live_,0x10);
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    utils::BitVector::Set(&this->all_components_live_,local_14);
  }
  return;
}

Assistant:

VectorDCE() : all_components_live_(kMaxVectorSize) {
    for (uint32_t i = 0; i < kMaxVectorSize; i++) {
      all_components_live_.Set(i);
    }
  }